

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

int yaml_emitter_close(yaml_emitter_t *emitter)

{
  int iVar1;
  undefined1 local_98 [8];
  yaml_mark_t mark;
  yaml_event_t event;
  yaml_emitter_t *emitter_local;
  
  memset(local_98,0,0x18);
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                  ,0x5b,"int yaml_emitter_close(yaml_emitter_t *)");
  }
  if (emitter->opened != 0) {
    if (emitter->closed == 0) {
      memset(&mark.column,0,0x68);
      mark.column._0_4_ = 2;
      iVar1 = yaml_emitter_emit(emitter,(yaml_event_t *)&mark.column);
      if (iVar1 == 0) {
        emitter_local._4_4_ = 0;
      }
      else {
        emitter->closed = 1;
        emitter_local._4_4_ = 1;
      }
    }
    else {
      emitter_local._4_4_ = 1;
    }
    return emitter_local._4_4_;
  }
  __assert_fail("emitter->opened",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                ,0x5c,"int yaml_emitter_close(yaml_emitter_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_close(yaml_emitter_t *emitter)
{
    yaml_event_t event;
    yaml_mark_t mark = { 0, 0, 0 };

    assert(emitter);            /* Non-NULL emitter object is required. */
    assert(emitter->opened);    /* Emitter should be opened. */

    if (emitter->closed) return 1;

    STREAM_END_EVENT_INIT(event, mark, mark);

    if (!yaml_emitter_emit(emitter, &event)) {
        return 0;
    }

    emitter->closed = 1;

    return 1;
}